

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https_client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  error_code ec_00;
  bool bVar1;
  byte bVar2;
  unsigned_long uVar3;
  ostream *poVar4;
  ulong uVar5;
  asio *this;
  char *pcVar6;
  void *this_00;
  istream *piVar7;
  size_t sVar8;
  system_error *this_01;
  type *in_R9;
  bind_t<bool,_bool_(*)(bool,_boost::asio::ssl::verify_context_&),_boost::_bi::list2<boost::arg<1>,_boost::arg<2>_>_>
  in_stack_fffffffffffff568;
  bool local_a5a;
  bool local_a2a;
  exception *e;
  error_code local_8c8;
  size_t local_8b8;
  string local_8b0 [8];
  string header;
  allocator local_889;
  string local_888 [39];
  byte local_861;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_860 [32];
  string local_840 [8];
  string status_message;
  uint local_81c;
  string local_818 [4];
  uint status_code;
  string http_version;
  long local_7f8;
  istream response_stream;
  allocator local_6d9;
  string local_6d8 [39];
  allocator<char> local_6b1;
  undefined1 local_6b0 [8];
  streambuf response;
  const_buffer local_630;
  error_code local_620 [2];
  error_code local_600;
  error_code local_5f0 [2];
  undefined1 local_5d0 [48];
  error_code local_5a0 [2];
  error_code local_580;
  error_code *local_568;
  error_code local_558 [2];
  error_code local_538;
  int local_524;
  error_code local_520 [2];
  basic_resolver_iterator<boost::asio::ip::tcp> local_500;
  undefined1 local_4e8 [8];
  iterator endpoint_iterator;
  string local_4c8 [32];
  undefined1 local_4a8 [8];
  query query;
  resolver resolver;
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  socket;
  error_code ec;
  io_service io_service;
  context context;
  ostream request_stream;
  allocator<char> local_101;
  undefined1 local_100 [8];
  streambuf request;
  string local_98 [8];
  string parameters;
  allocator local_71;
  string local_70 [8];
  string path;
  allocator local_39;
  string local_38 [8];
  string server;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"www.instagram.com",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"/accounts/login/ajax/",&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_98,"username=fewfw&password=fewfw",
             (allocator *)
             &request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             &request.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
  uVar3 = std::numeric_limits<unsigned_long>::max();
  std::allocator<char>::allocator();
  boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_100,uVar3,&local_101);
  std::allocator<char>::~allocator(&local_101);
  std::ostream::ostream
            (&context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(streambuf *)local_100);
  poVar4 = std::operator<<((ostream *)
                           &context.init_.ref_.
                            super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"POST ");
  poVar4 = std::operator<<(poVar4,local_70);
  std::operator<<(poVar4," HTTP/1.1\r\n");
  poVar4 = std::operator<<((ostream *)
                           &context.init_.ref_.
                            super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"Host: ");
  poVar4 = std::operator<<(poVar4,local_38);
  std::operator<<(poVar4,"\r\n");
  std::operator<<((ostream *)
                  &context.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,"Accept: */*\r\n");
  std::operator<<((ostream *)
                  &context.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,"X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n");
  poVar4 = std::operator<<((ostream *)
                           &context.init_.ref_.
                            super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"Referer: https://");
  poVar4 = std::operator<<(poVar4,local_38);
  std::operator<<(poVar4,"/\r\n");
  poVar4 = std::operator<<((ostream *)
                           &context.init_.ref_.
                            super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount,"Content-Length: ");
  uVar5 = std::__cxx11::string::size();
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar5);
  std::operator<<(poVar4,"\r\n");
  std::operator<<((ostream *)
                  &context.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,
                  "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n"
                 );
  std::operator<<((ostream *)
                  &context.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,"Connection: close\r\n\r\n");
  std::operator<<((ostream *)
                  &context.init_.ref_.
                   super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount,local_98);
  boost::asio::ssl::context::context((context *)&io_service.impl_,sslv23);
  boost::asio::ssl::context::set_default_verify_paths((context *)&io_service.impl_);
  boost::asio::io_context::io_context((io_context *)&ec.cat_);
  boost::system::error_code::error_code((error_code *)&socket.core_.input_.size_);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::stream<boost::asio::io_context&>
            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
              *)&resolver.impl_.executor_.prop_fns_,(io_context *)&ec.cat_,
             (context *)&io_service.impl_);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<boost::asio::io_context>
            ((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&query.field_0x68,(io_context *)&ec.cat_,(type *)0x0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"https",(allocator *)((long)&endpoint_iterator.index_ + 7))
  ;
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_4a8,(string *)local_38,
             (string *)local_4c8,address_configured);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&endpoint_iterator.index_ + 7));
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve((results_type *)&local_500,
            (basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
             *)&query.field_0x68,(query *)local_4a8,(error_code *)&socket.core_.input_.size_);
  boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
            ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_4e8,&local_500);
  boost::asio::ip::basic_resolver_results<boost::asio::ip::tcp>::~basic_resolver_results
            ((basic_resolver_results<boost::asio::ip::tcp> *)&local_500);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&socket.core_.input_.size_)
  ;
  if (bVar1) {
    boost::system::error_code::message_abi_cxx11_(local_520);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_520);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_520);
    argv_local._4_4_ = -1;
    local_524 = 1;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Resolve OK");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_538 = boost::asio::ssl::
                stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                ::set_verify_mode((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                   *)&resolver.impl_.executor_.prop_fns_,1,
                                  (error_code *)&socket.core_.input_.size_);
    bVar1 = boost::system::error_code::operator_cast_to_bool
                      ((error_code *)&socket.core_.input_.size_);
    if (bVar1) {
      boost::system::error_code::message_abi_cxx11_(local_558);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_558);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_558);
      argv_local._4_4_ = -1;
      local_524 = 1;
    }
    else {
      local_568 = (error_code *)
                  boost::
                  bind<bool,bool,boost::asio::ssl::verify_context&,boost::arg<1>,boost::arg<2>>
                            (verify_certificate);
      local_580 = boost::asio::ssl::
                  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  ::
                  set_verify_callback<boost::_bi::bind_t<bool,bool(*)(bool,boost::asio::ssl::verify_context&),boost::_bi::list2<boost::arg<1>,boost::arg<2>>>>
                            ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                              *)&resolver.impl_.executor_.prop_fns_,in_stack_fffffffffffff568,
                             local_568);
      bVar1 = boost::system::error_code::operator_cast_to_bool
                        ((error_code *)&socket.core_.input_.size_);
      if (bVar1) {
        boost::system::error_code::message_abi_cxx11_((error_code *)(local_5d0 + 0x30));
        poVar4 = std::operator<<((ostream *)&std::cout,(string *)(local_5d0 + 0x30));
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)(local_5d0 + 0x30));
        argv_local._4_4_ = -1;
        local_524 = 1;
      }
      else {
        this = (asio *)boost::asio::ssl::
                       stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                       ::lowest_layer((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                       *)&resolver.impl_.executor_.prop_fns_);
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::basic_resolver_iterator
                  ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_5d0,
                   (basic_resolver_iterator<boost::asio::ip::tcp> *)local_4e8);
        boost::asio::
        connect<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>>
                  ((basic_resolver_iterator<boost::asio::ip::tcp> *)(local_5d0 + 0x18),this,
                   (basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                    *)local_5d0,
                   (basic_resolver_iterator<boost::asio::ip::tcp> *)&socket.core_.input_.size_,
                   (error_code *)0x0,in_R9);
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
                  ((basic_resolver_iterator<boost::asio::ip::tcp> *)(local_5d0 + 0x18));
        boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
                  ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_5d0);
        bVar1 = boost::system::error_code::operator_cast_to_bool
                          ((error_code *)&socket.core_.input_.size_);
        if (bVar1) {
          boost::system::error_code::message_abi_cxx11_(local_5f0);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_5f0);
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_5f0);
          argv_local._4_4_ = -1;
          local_524 = 1;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,"Connect OK");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          local_600 = boost::asio::ssl::
                      stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                      ::handshake((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                   *)&resolver.impl_.executor_.prop_fns_,client,
                                  (error_code *)&socket.core_.input_.size_);
          bVar1 = boost::system::error_code::operator_cast_to_bool
                            ((error_code *)&socket.core_.input_.size_);
          if (bVar1) {
            boost::system::error_code::message_abi_cxx11_(local_620);
            poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_620);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string((string *)local_620);
            argv_local._4_4_ = -1;
            local_524 = 1;
          }
          else {
            poVar4 = std::operator<<((ostream *)&std::cout,"Handshake OK");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            poVar4 = std::operator<<((ostream *)&std::cout,"Print request:");
            poVar4 = std::operator<<(poVar4,"\n****************************************\n");
            local_630 = (const_buffer)
                        boost::asio::basic_streambuf<std::allocator<char>_>::data
                                  ((basic_streambuf<std::allocator<char>_> *)local_100);
            pcVar6 = boost::asio::buffer_cast<char_const*>(&local_630);
            poVar4 = std::operator<<(poVar4,pcVar6);
            poVar4 = std::operator<<(poVar4,"\n****************************************");
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            boost::asio::
            write<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                      ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                        *)&resolver.impl_.executor_.prop_fns_,
                       (basic_streambuf<std::allocator<char>_> *)local_100,
                       (error_code *)&socket.core_.input_.size_);
            bVar1 = boost::system::error_code::operator_cast_to_bool
                              ((error_code *)&socket.core_.input_.size_);
            if (bVar1) {
              boost::system::error_code::message_abi_cxx11_
                        ((error_code *)
                         &response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
              poVar4 = std::operator<<((ostream *)&std::cout,
                                       (string *)
                                       &response.buffer_.
                                        super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                        field_0x10);
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              std::__cxx11::string::~string
                        ((string *)
                         &response.buffer_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
              argv_local._4_4_ = -1;
              local_524 = 1;
            }
            else {
              poVar4 = std::operator<<((ostream *)&std::cout,"Write OK");
              std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
              uVar3 = std::numeric_limits<unsigned_long>::max();
              std::allocator<char>::allocator();
              boost::asio::basic_streambuf<std::allocator<char>_>::basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)local_6b0,uVar3,&local_6b1);
              std::allocator<char>::~allocator(&local_6b1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_6d8,"\r\n",&local_6d9);
              boost::asio::
              read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                        ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                          *)&resolver.impl_.executor_.prop_fns_,
                         (basic_streambuf<std::allocator<char>_> *)local_6b0,(string *)local_6d8);
              std::__cxx11::string::~string(local_6d8);
              std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
              std::istream::istream(&local_7f8,(streambuf *)local_6b0);
              std::__cxx11::string::string(local_818);
              std::operator>>((istream *)&local_7f8,local_818);
              std::istream::operator>>(&local_7f8,&local_81c);
              std::__cxx11::string::string(local_840);
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&local_7f8,local_840);
              local_861 = 0;
              bVar2 = std::ios::operator!((ios *)((long)&local_7f8 + *(long *)(local_7f8 + -0x18)));
              local_a2a = true;
              if ((bVar2 & 1) == 0) {
                std::__cxx11::string::substr((ulong)local_860,(ulong)local_818);
                local_861 = 1;
                local_a2a = std::operator!=(local_860,"HTTP/");
              }
              if ((local_861 & 1) != 0) {
                std::__cxx11::string::~string((string *)local_860);
              }
              if (local_a2a == false) {
                poVar4 = std::operator<<((ostream *)&std::cout,"Response returned with status code "
                                        );
                this_00 = (void *)std::ostream::operator<<(poVar4,local_81c);
                std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_888,"\r\n\r\n",&local_889);
                boost::asio::
                read_until<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>>
                          ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                            *)&resolver.impl_.executor_.prop_fns_,
                           (basic_streambuf<std::allocator<char>_> *)local_6b0,(string *)local_888);
                std::__cxx11::string::~string(local_888);
                std::allocator<char>::~allocator((allocator<char> *)&local_889);
                std::__cxx11::string::string(local_8b0);
                while( true ) {
                  piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                     ((istream *)&local_7f8,local_8b0);
                  bVar1 = std::ios::operator_cast_to_bool
                                    ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
                  local_a5a = false;
                  if (bVar1) {
                    local_a5a = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_8b0,"\r");
                  }
                  if (local_a5a == false) break;
                  poVar4 = std::operator<<((ostream *)&std::cout,local_8b0);
                  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                }
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                sVar8 = boost::asio::basic_streambuf<std::allocator<char>_>::size
                                  ((basic_streambuf<std::allocator<char>_> *)local_6b0);
                if (sVar8 != 0) {
                  std::ostream::operator<<(&std::cout,(streambuf *)local_6b0);
                }
                while( true ) {
                  local_8b8 = (size_t)boost::asio::transfer_at_least(1);
                  sVar8 = boost::asio::
                          read<boost::asio::ssl::stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,std::allocator<char>,boost::asio::detail::transfer_at_least_t>
                                    ((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                                      *)&resolver.impl_.executor_.prop_fns_,
                                     (basic_streambuf<std::allocator<char>_> *)local_6b0,
                                     (transfer_at_least_t)local_8b8,
                                     (error_code *)&socket.core_.input_.size_);
                  if (sVar8 == 0) break;
                  std::ostream::operator<<(&std::cout,(streambuf *)local_6b0);
                }
                std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
                boost::system::error_code::error_code<boost::asio::error::misc_errors>
                          (&local_8c8,eof,(type *)0x0);
                bVar1 = boost::system::operator!=
                                  ((error_code *)&socket.core_.input_.size_,&local_8c8);
                if (bVar1) {
                  this_01 = (system_error *)__cxa_allocate_exception(0x40);
                  ec_00.cat_ = (error_category *)ec._0_8_;
                  ec_00.val_ = (undefined4)socket.core_.input_.size_;
                  ec_00.failed_ = (bool)socket.core_.input_.size_._4_1_;
                  ec_00._5_3_ = socket.core_.input_.size_._5_3_;
                  boost::system::system_error::system_error(this_01,ec_00);
                  __cxa_throw(this_01,&boost::system::system_error::typeinfo,
                              boost::system::system_error::~system_error);
                }
                std::__cxx11::string::~string(local_8b0);
                local_524 = 0;
              }
              else {
                poVar4 = std::operator<<((ostream *)&std::cout,"Invalid response");
                std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
                argv_local._4_4_ = -1;
                local_524 = 1;
              }
              std::__cxx11::string::~string(local_840);
              std::__cxx11::string::~string(local_818);
              std::istream::~istream(&local_7f8);
              boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
                        ((basic_streambuf<std::allocator<char>_> *)local_6b0);
            }
          }
        }
      }
    }
  }
  boost::asio::ip::basic_resolver_iterator<boost::asio::ip::tcp>::~basic_resolver_iterator
            ((basic_resolver_iterator<boost::asio::ip::tcp> *)local_4e8);
  boost::asio::ip::basic_resolver_query<boost::asio::ip::tcp>::~basic_resolver_query
            ((basic_resolver_query<boost::asio::ip::tcp> *)local_4a8);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_resolver((basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&query.field_0x68);
  boost::asio::ssl::
  stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
  ::~stream((stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
             *)&resolver.impl_.executor_.prop_fns_);
  boost::asio::io_context::~io_context((io_context *)&ec.cat_);
  boost::asio::ssl::context::~context((context *)&io_service.impl_);
  std::ostream::~ostream
            (&context.init_.ref_.
              super___shared_ptr<boost::asio::ssl::detail::openssl_init_base::do_init,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  boost::asio::basic_streambuf<std::allocator<char>_>::~basic_streambuf
            ((basic_streambuf<std::allocator<char>_> *)local_100);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  if (local_524 == 0) {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {

  try {

    // Define server and path
    std::string const server = "www.instagram.com";
    std::string const path = "/accounts/login/ajax/";
    std::string const parameters = "username=fewfw&password=fewfw";

    //while (1) {

      // Define request
      boost::asio::streambuf request;
      std::ostream request_stream(&request);
      request_stream << "POST " << path << " HTTP/1.1\r\n";
      request_stream << "Host: " << server << "\r\n";
      // User-Agent is not mandatory
      request_stream << "Accept: */*\r\n";
      // Accept-Language is not mandatory
      // Accept-Encoding is not mandatory
      request_stream << "X-CSRFToken: fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY\r\n";
      // Content-Type is not mandatory
      // X-Requested-With is not mandatory
      request_stream << "Referer: https://" << server << "/\r\n";
      request_stream << "Content-Length: " << parameters.size() << "\r\n";
      request_stream
        << "Cookie: csrftoken=fqRL4xVdB6w0qBT7kqAqMVQeFIasCmkY; mid=V-I19wAEAAG8pOV3FUjiNYJVw2Z-; ig_pr=2; ig_vw=1440\r\n";
      request_stream << "Connection: close\r\n\r\n";
      request_stream << parameters;

      // Create ssl context
      boost::asio::ssl::context context(boost::asio::ssl::context::sslv23);
      context.set_default_verify_paths();

      // Create io_service
      boost::asio::io_service io_service;

      // Create the boost system error code
      boost::system::error_code ec;

      // Creatre socket
      boost::asio::ssl::stream<boost::asio::ip::tcp::socket> socket(
          io_service,
          context);

      // Get a list of endpoints corresponding to the server name
      boost::asio::ip::tcp::resolver resolver(io_service);
      boost::asio::ip::tcp::resolver::query query(server, "https");
      boost::asio::ip::tcp::resolver::iterator endpoint_iterator = resolver
          .resolve(query, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Resolve OK" << std::endl;

      // Set the peer verification mode
      socket.set_verify_mode(boost::asio::ssl::verify_peer, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Set the callback used to verify peer certificates
      socket.set_verify_callback(boost::bind(verify_certificate, _1, _2), ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }

      // Try each endpoint until we successfully establish a connection
      boost::asio::connect(socket.lowest_layer(), endpoint_iterator, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Connect OK" << std::endl;

      // Perform SSL handshaking
      socket.handshake(boost::asio::ssl::stream_base::client, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Handshake OK" << std::endl;

      // Print the request
      std::cout
        << "Print request:"
        << "\n****************************************\n"
        << boost::asio::buffer_cast<const char*>(request.data())
        << "\n****************************************"
        << std::endl;

      // Send the request
      boost::asio::write(socket, request, ec);
      if (ec) {
        // Error
        std::cout << ec.message() << std::endl;
        return -1;
      }
      std::cout << "Write OK" << std::endl;

      // Read the response status line. The response streambuf will automatically
      // grow to accommodate the entire line. The growth may be limited by passing
      // a maximum size to the streambuf constructor.
      boost::asio::streambuf response;
      boost::asio::read_until(socket, response, "\r\n");

      // Check that response is OK
      std::istream response_stream(&response);
      std::string http_version;
      response_stream >> http_version;
      unsigned int status_code;
      response_stream >> status_code;
      std::string status_message;
      std::getline(response_stream, status_message);
      if (!response_stream || http_version.substr(0, 5) != "HTTP/") {
        std::cout << "Invalid response" << std::endl;
        return -1;
      }

      // Print the response status code
      std::cout
        << "Response returned with status code "
        << status_code
        << std::endl;

      // Read the response headers, which are terminated by a blank line
      boost::asio::read_until(socket, response, "\r\n\r\n");

      // Process the response headers
      std::string header;
      while (std::getline(response_stream, header) && header != "\r") {
        std::cout << header << std::endl;
      }
      std::cout << std::endl;

      // Write whatever content we already have to output
      if (response.size() > 0) {
        std::cout << &response;
      }

      // Read until EOF, writing data to output as we go
      while (boost::asio::read(
          socket,
          response,
          boost::asio::transfer_at_least(1),
          ec)) {
        std::cout << &response;
      }
      std::cout << std::endl;
      if (ec != boost::asio::error::eof) {
        throw boost::system::system_error(ec);
      }

    //}

  } catch (std::exception& e) {
    std::cout << "Exception: " << e.what() << std::endl;
  }

  return 0;
}